

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

void __thiscall Catch::BasicReporter::EndTesting(BasicReporter *this,Totals *totals)

{
  ostream *poVar1;
  allocator<char> local_31;
  string local_30;
  
  poVar1 = (this->m_config).stream;
  if (this->m_aborted == true) {
    std::operator<<(poVar1,"\n[Testing aborted. ");
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_30,"The first ",&local_31);
    ReportCounts(this,totals,&local_30);
  }
  else {
    std::operator<<(poVar1,"\n[Testing completed. ");
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_30,"All ",&local_31);
    ReportCounts(this,totals,&local_30);
  }
  std::__cxx11::string::~string((string *)&local_30);
  poVar1 = std::operator<<((this->m_config).stream,"]\n");
  std::endl<char,std::char_traits<char>>(poVar1);
  return;
}

Assistant:

virtual void EndTesting( const Totals& totals ) {
            // Output the overall test results even if "Started Testing" was not emitted
            if( m_aborted ) {
                m_config.stream << "\n[Testing aborted. ";
                ReportCounts( totals, "The first " );
            }
            else {
                m_config.stream << "\n[Testing completed. ";
                ReportCounts( totals );
            }
            m_config.stream << "]\n" << std::endl;
        }